

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O1

pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_> *
create_pattern_tree(pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_>
                    *__return_storage_ptr__,string *doc)

{
  __node_base *p_Var1;
  _Hash_node_base *p_Var2;
  OptionsShortcut *pOVar3;
  pointer pOVar4;
  pointer psVar5;
  pointer psVar6;
  pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_> *ppVar7;
  const_iterator cVar8;
  runtime_error *this;
  Option *opt;
  pointer pOVar9;
  pointer ppOVar10;
  PatternList children;
  vector<docopt::Option,_std::allocator<docopt::Option>_> options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  usage_sections;
  UniqueOptions uniq_pattern_options;
  vector<docopt::Option,_std::allocator<docopt::Option>_> doc_options;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> pattern_options;
  Required pattern;
  UniqueOptions uniq_doc_options;
  undefined1 local_1c9;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_1c8;
  Option *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  pointer local_198;
  pointer psStack_190;
  pointer local_188;
  vector<docopt::Option,_std::allocator<docopt::Option>_> local_178;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_158;
  pair<docopt::Required,_std::vector<docopt::Option,_std::allocator<docopt::Option>_>_> *local_140;
  string *local_138;
  pointer local_130;
  pointer local_128;
  vector<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_> local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  _Hashtable<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_f0;
  vector<docopt::Option,_std::allocator<docopt::Option>_> local_b8;
  vector<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_> local_a0;
  Required local_88;
  undefined1 local_68 [56];
  
  p_Var1 = &local_f0._M_before_begin;
  local_f0._M_buckets = &p_Var1->_M_nxt;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"usage:","");
  parse_section(&local_108,(string *)&local_f0,doc);
  if ((__node_base *)local_f0._M_buckets != p_Var1) {
    operator_delete(local_f0._M_buckets);
  }
  if (local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_108.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"\'usage:\' (case-insensitive) not found.");
  }
  else {
    if ((ulong)((long)local_108.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_108.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      parse_defaults(&local_178,doc);
      formal_usage((string *)&local_f0,
                   local_108.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      parse_pattern(&local_88,(string *)&local_f0,&local_178);
      if ((__node_base *)local_f0._M_buckets != p_Var1) {
        operator_delete(local_f0._M_buckets);
      }
      flat_filter<docopt::Option_const>(&local_a0,(Pattern *)&local_88);
      std::
      _Hashtable<docopt::Option_const*,docopt::Option_const*,std::allocator<docopt::Option_const*>,std::__detail::_Identity,docopt::PatternPointerEquality,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _Hashtable<__gnu_cxx::__normal_iterator<docopt::Option_const**,std::vector<docopt::Option_const*,std::allocator<docopt::Option_const*>>>>
                ((_Hashtable<docopt::Option_const*,docopt::Option_const*,std::allocator<docopt::Option_const*>,std::__detail::_Identity,docopt::PatternPointerEquality,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&local_f0,
                 local_a0.
                 super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_a0.
                 super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,0,local_68,&local_1c8,&local_120);
      local_140 = __return_storage_ptr__;
      flat_filter<docopt::OptionsShortcut>(&local_120,(Pattern *)&local_88);
      local_130 = local_120.
                  super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_120.
          super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_120.
          super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        ppOVar10 = local_120.
                   super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_138 = doc;
        do {
          local_128 = ppOVar10;
          parse_defaults(&local_b8,local_138);
          pOVar4 = local_b8.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          local_68._0_8_ = local_68 + 0x30;
          local_68._8_8_ = (pointer)0x1;
          local_68._16_8_ = (_Hash_node_base *)0x0;
          local_68._24_8_ = 0;
          local_68._32_4_ = 0x3f800000;
          local_68._40_8_ = 0;
          local_68._48_8_ = 0;
          for (pOVar9 = local_b8.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppOVar10 = local_128,
              pOVar9 != pOVar4; pOVar9 = pOVar9 + 1) {
            local_1c8.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pOVar9;
            cVar8 = std::
                    _Hashtable<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find(&local_f0,(key_type *)&local_1c8);
            if (cVar8.super__Node_iterator_base<const_docopt::Option_*,_true>._M_cur ==
                (__node_type *)0x0) {
              local_1c8.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_68;
              local_198 = pOVar9;
              std::
              _Hashtable<docopt::Option_const*,docopt::Option_const*,std::allocator<docopt::Option_const*>,std::__detail::_Identity,docopt::PatternPointerEquality,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<docopt::Option_const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<docopt::Option_const*,true>>>>
                        ((_Hashtable<docopt::Option_const*,docopt::Option_const*,std::allocator<docopt::Option_const*>,std::__detail::_Identity,docopt::PatternPointerEquality,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)local_1c8.
                            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                         (vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                          *)&local_198,&local_1c8);
            }
          }
          local_198 = (pointer)0x0;
          psStack_190 = (pointer)0x0;
          local_188 = (pointer)0x0;
          pOVar4 = local_198;
          psVar5 = psStack_190;
          psVar6 = local_188;
          for (p_Var2 = (_Hash_node_base *)local_68._16_8_; p_Var2 != (_Hash_node_base *)0x0;
              p_Var2 = p_Var2->_M_nxt) {
            local_1a8 = (pointer)0x0;
            local_198 = pOVar4;
            psStack_190 = psVar5;
            local_188 = psVar6;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<docopt::Option,std::allocator<docopt::Option>,docopt::Option_const&>
                      (&_Stack_1a0,&local_1a8,(allocator<docopt::Option> *)&local_1c9,
                       (Option *)p_Var2[1]._M_nxt);
            local_1c8.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1a8;
            local_1c8.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_1a0._M_pi;
            local_1a8 = (Option *)0x0;
            _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            std::
            vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
            ::emplace_back<std::shared_ptr<docopt::Pattern>>
                      ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                        *)&local_198,(shared_ptr<docopt::Pattern> *)&local_1c8);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_1c8.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_1c8.
                         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            if (_Stack_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
            }
            pOVar4 = local_198;
            psVar5 = psStack_190;
            psVar6 = local_188;
          }
          pOVar3 = *ppOVar10;
          local_198 = (pointer)0x0;
          psStack_190 = (pointer)0x0;
          local_188 = (pointer)0x0;
          local_1c8.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pOVar3->super_Optional).super_BranchPattern.fChildren.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1c8.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pOVar3->super_Optional).super_BranchPattern.fChildren.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1c8.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pOVar3->super_Optional).super_BranchPattern.fChildren.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          (pOVar3->super_Optional).super_BranchPattern.fChildren.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pOVar4;
          (pOVar3->super_Optional).super_BranchPattern.fChildren.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = psVar5;
          (pOVar3->super_Optional).super_BranchPattern.fChildren.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar6;
          local_158.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector(&local_1c8);
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector(&local_158);
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)&local_198);
          std::
          _Hashtable<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_68);
          std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector(&local_b8);
          ppOVar10 = ppOVar10 + 1;
        } while (ppOVar10 != local_130);
      }
      if (local_120.
          super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.
                        super__Vector_base<docopt::OptionsShortcut_*,_std::allocator<docopt::OptionsShortcut_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      ppVar7 = local_140;
      (local_140->first).super_BranchPattern.super_Pattern._vptr_Pattern =
           (_func_int **)&PTR_flat_001b9648;
      (local_140->first).super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_88.super_BranchPattern.fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (local_140->first).super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_88.super_BranchPattern.fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (local_140->first).super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_88.super_BranchPattern.fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88.super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88.super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super_BranchPattern.fChildren.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_140->first).super_BranchPattern.super_Pattern._vptr_Pattern =
           (_func_int **)&PTR_flat_001b9438;
      (local_140->second).super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_178.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
           super__Vector_impl_data._M_start;
      (local_140->second).super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_178.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (local_140->second).super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_178.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_178.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_178.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_178.super__Vector_base<docopt::Option,_std::allocator<docopt::Option>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      _Hashtable<const_docopt::Option_*,_const_docopt::Option_*,_std::allocator<const_docopt::Option_*>,_std::__detail::_Identity,_docopt::PatternPointerEquality,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_f0);
      if (local_a0.
          super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.
                        super__Vector_base<const_docopt::Option_*,_std::allocator<const_docopt::Option_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      local_88.super_BranchPattern.super_Pattern._vptr_Pattern = (_func_int **)&PTR_flat_001b9648;
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(&local_88.super_BranchPattern.fChildren);
      std::vector<docopt::Option,_std::allocator<docopt::Option>_>::~vector(&local_178);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_108);
      return ppVar7;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"More than one \'usage:\' (case-insensitive).");
  }
  *(undefined ***)this = &PTR__runtime_error_001b9620;
  __cxa_throw(this,&docopt::DocoptLanguageError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::pair<Required, std::vector<Option>> create_pattern_tree(std::string const& doc)
{
	auto usage_sections = parse_section("usage:", doc);
	if (usage_sections.empty()) {
		throw DocoptLanguageError("'usage:' (case-insensitive) not found.");
	}
	if (usage_sections.size() > 1) {
		throw DocoptLanguageError("More than one 'usage:' (case-insensitive).");
	}
	
	std::vector<Option> options = parse_defaults(doc);
	Required pattern = parse_pattern(formal_usage(usage_sections[0]), options);
	
	std::vector<Option const*> pattern_options = flat_filter<Option const>(pattern);
	
	using UniqueOptions = std::unordered_set<Option const*, PatternHasher, PatternPointerEquality>;
	UniqueOptions const uniq_pattern_options { pattern_options.begin(), pattern_options.end() };
	
	// Fix up any "[options]" shortcuts with the actual option tree
	for(auto& options_shortcut : flat_filter<OptionsShortcut>(pattern)) {
		std::vector<Option> doc_options = parse_defaults(doc);
		
		// set(doc_options) - set(pattern_options)
		UniqueOptions uniq_doc_options;
		for(auto const& opt : doc_options) {
			if (uniq_pattern_options.count(&opt))
				continue;
			uniq_doc_options.insert(&opt);
		}
		
		// turn into shared_ptr's and set as children
		PatternList children;
		std::transform(uniq_doc_options.begin(), uniq_doc_options.end(),
			       std::back_inserter(children), [](Option const* opt) {
				       return std::make_shared<Option>(*opt);
			       });
		options_shortcut->setChildren(std::move(children));
	}
	
	return { std::move(pattern), std::move(options) };
}